

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayFill * __thiscall
wasm::Builder::makeArrayFill
          (Builder *this,Expression *ref,Expression *index,Expression *value,Expression *size)

{
  ArrayFill *this_00;
  ArrayFill *ret;
  Expression *size_local;
  Expression *value_local;
  Expression *index_local;
  Expression *ref_local;
  Builder *this_local;
  
  this_00 = MixedArena::alloc<wasm::ArrayFill>(&this->wasm->allocator);
  this_00->ref = ref;
  this_00->index = index;
  this_00->value = value;
  this_00->size = size;
  ArrayFill::finalize(this_00);
  return this_00;
}

Assistant:

ArrayFill* makeArrayFill(Expression* ref,
                           Expression* index,
                           Expression* value,
                           Expression* size) {
    auto* ret = wasm.allocator.alloc<ArrayFill>();
    ret->ref = ref;
    ret->index = index;
    ret->value = value;
    ret->size = size;
    ret->finalize();
    return ret;
  }